

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_cHRM(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  png_byte buf [32];
  png_xy xy;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  png_xy local_40;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if (length == 0x20) {
      png_crc_read(png_ptr,(png_bytep)&local_68,0x20);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 != 0) {
        return;
      }
      local_40.whitey = 0xffffffff;
      local_40.whitex = 0xffffffff;
      if (-1 < (int)(local_68 << 0x18)) {
        local_40.whitex =
             local_68 >> 0x18 | (local_68 >> 8 & 0xff) << 0x10 | (local_68 >> 0x10 & 0xff) << 8 |
             local_68 << 0x18;
      }
      if (-1 < (int)(local_64 << 0x18)) {
        local_40.whitey =
             local_64 >> 0x18 | (local_64 >> 8 & 0xff) << 0x10 | (local_64 >> 0x10 & 0xff) << 8 |
             local_64 << 0x18;
      }
      local_40.redy = 0xffffffff;
      local_40.redx = 0xffffffff;
      if (-1 < (int)(local_60 << 0x18)) {
        local_40.redx =
             local_60 >> 0x18 | (local_60 >> 8 & 0xff) << 0x10 | (local_60 >> 0x10 & 0xff) << 8 |
             local_60 << 0x18;
      }
      if (-1 < (int)(local_5c << 0x18)) {
        local_40.redy =
             local_5c >> 0x18 | (local_5c >> 8 & 0xff) << 0x10 | (local_5c >> 0x10 & 0xff) << 8 |
             local_5c << 0x18;
      }
      local_40.greeny = 0xffffffff;
      local_40.greenx = 0xffffffff;
      if (-1 < (int)(local_58 << 0x18)) {
        local_40.greenx =
             local_58 >> 0x18 | (local_58 >> 8 & 0xff) << 0x10 | (local_58 >> 0x10 & 0xff) << 8 |
             local_58 << 0x18;
      }
      if (-1 < (int)(local_54 << 0x18)) {
        local_40.greeny =
             local_54 >> 0x18 | (local_54 >> 8 & 0xff) << 0x10 | (local_54 >> 0x10 & 0xff) << 8 |
             local_54 << 0x18;
      }
      local_40.bluey = 0xffffffff;
      local_40.bluex = 0xffffffff;
      if (-1 < (int)(local_50 << 0x18)) {
        local_40.bluex =
             local_50 >> 0x18 | (local_50 >> 8 & 0xff) << 0x10 | (local_50 >> 0x10 & 0xff) << 8 |
             local_50 << 0x18;
      }
      if (-1 < (int)(local_4c << 0x18)) {
        local_40.bluey =
             local_4c >> 0x18 | (local_4c >> 8 & 0xff) << 0x10 | (local_4c >> 0x10 & 0xff) << 8 |
             local_4c << 0x18;
      }
      if (((((local_40.whitex == 0xffffffff) || (local_40.whitey == 0xffffffff)) ||
           (local_40.redx == 0xffffffff)) ||
          ((local_40.redy == 0xffffffff || (local_40.greenx == 0xffffffff)))) ||
         ((local_40.greeny == 0xffffffff ||
          ((local_40.bluex == 0xffffffff || (local_40.bluey == 0xffffffff)))))) {
        pcVar3 = "invalid values";
      }
      else {
        uVar1 = (png_ptr->colorspace).flags;
        if ((short)uVar1 < 0) {
          return;
        }
        if ((uVar1 & 0x10) == 0) {
          (png_ptr->colorspace).flags = uVar1 | 0x10;
          png_colorspace_set_chromaticities(png_ptr,&png_ptr->colorspace,&local_40,1);
          png_colorspace_sync(png_ptr,info_ptr);
          return;
        }
        (png_ptr->colorspace).flags = uVar1 | 0x8000;
        png_colorspace_sync(png_ptr,info_ptr);
        pcVar3 = "duplicate";
      }
      png_chunk_benign_error(png_ptr,pcVar3);
      return;
    }
    png_crc_finish(png_ptr,length);
    pcVar3 = "invalid";
  }
  else {
    png_crc_finish(png_ptr,length);
    pcVar3 = "out of place";
  }
  png_chunk_benign_error(png_ptr,pcVar3);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_cHRM(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[32];
   png_xy xy;

   png_debug(1, "in png_handle_cHRM");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (length != 32)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 32);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   xy.whitex = png_get_fixed_point(NULL, buf);
   xy.whitey = png_get_fixed_point(NULL, buf + 4);
   xy.redx   = png_get_fixed_point(NULL, buf + 8);
   xy.redy   = png_get_fixed_point(NULL, buf + 12);
   xy.greenx = png_get_fixed_point(NULL, buf + 16);
   xy.greeny = png_get_fixed_point(NULL, buf + 20);
   xy.bluex  = png_get_fixed_point(NULL, buf + 24);
   xy.bluey  = png_get_fixed_point(NULL, buf + 28);

   if (xy.whitex == PNG_FIXED_ERROR ||
       xy.whitey == PNG_FIXED_ERROR ||
       xy.redx   == PNG_FIXED_ERROR ||
       xy.redy   == PNG_FIXED_ERROR ||
       xy.greenx == PNG_FIXED_ERROR ||
       xy.greeny == PNG_FIXED_ERROR ||
       xy.bluex  == PNG_FIXED_ERROR ||
       xy.bluey  == PNG_FIXED_ERROR)
   {
      png_chunk_benign_error(png_ptr, "invalid values");
      return;
   }

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
      return;

   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_FROM_cHRM) != 0)
   {
      png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
      png_colorspace_sync(png_ptr, info_ptr);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   png_ptr->colorspace.flags |= PNG_COLORSPACE_FROM_cHRM;
   (void)png_colorspace_set_chromaticities(png_ptr, &png_ptr->colorspace, &xy,
       1/*prefer cHRM values*/);
   png_colorspace_sync(png_ptr, info_ptr);
}